

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O1

Octant * __thiscall
unibn::Octree<CustomPoint,_std::vector<CustomPoint,_std::allocator<CustomPoint>_>_>::createOctant
          (Octree<CustomPoint,_std::vector<CustomPoint,_std::allocator<CustomPoint>_>_> *this,
          float x,float y,float z,float extent,uint32_t startIdx,uint32_t endIdx,uint32_t size)

{
  int *piVar1;
  float fVar2;
  uint32_t size_00;
  vector<CustomPoint,_std::allocator<CustomPoint>_> *pvVar3;
  pointer pCVar4;
  pointer puVar5;
  Octant *pOVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  Octant *pOVar10;
  uint32_t *puVar11;
  uint uVar12;
  ulong uVar13;
  pointer puVar14;
  uint32_t i;
  uint uVar15;
  bool bVar16;
  
  pOVar6 = (Octant *)operator_new(0x60);
  pOVar6->x = 0.0;
  pOVar6->y = 0.0;
  pOVar6->z = 0.0;
  pOVar6->extent = 0.0;
  pOVar6->start = 0;
  pOVar6->end = 0;
  *(undefined8 *)&pOVar6->size = 0;
  *(undefined8 *)((long)pOVar6->child + 4) = 0;
  *(undefined8 *)((long)pOVar6->child + 0xc) = 0;
  *(undefined8 *)((long)pOVar6->child + 0x14) = 0;
  *(undefined8 *)((long)pOVar6->child + 0x1c) = 0;
  *(undefined8 *)((long)pOVar6->child + 0x24) = 0;
  *(undefined8 *)((long)pOVar6->child + 0x2c) = 0;
  pOVar6->child[6] = (Octant *)0x0;
  pOVar6->child[7] = (Octant *)0x0;
  pOVar6->isLeaf = true;
  pOVar6->x = x;
  pOVar6->y = y;
  pOVar6->z = z;
  pOVar6->extent = extent;
  pOVar6->start = startIdx;
  pOVar6->end = endIdx;
  pOVar6->size = size;
  if (((this->params_).bucketSize < size) &&
     (fVar2 = (this->params_).minExtent, fVar2 + fVar2 < extent)) {
    pOVar6->isLeaf = false;
    pvVar3 = this->data_;
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = 0;
    puVar7[1] = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    puVar8 = (undefined8 *)operator_new(0x20);
    puVar8[2] = 0;
    puVar8[3] = 0;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar9 = (undefined8 *)operator_new(0x20);
    puVar9[2] = 0;
    puVar9[3] = 0;
    *puVar9 = 0;
    puVar9[1] = 0;
    pCVar4 = (pvVar3->super__Vector_base<CustomPoint,_std::allocator<CustomPoint>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar16 = x < pCVar4[startIdx].x;
      uVar12 = bVar16 + 2;
      if (pCVar4[startIdx].y <= y) {
        uVar12 = (uint)bVar16;
      }
      uVar15 = uVar12 + 4;
      if (pCVar4[startIdx].z <= z) {
        uVar15 = uVar12;
      }
      uVar13 = (ulong)uVar15;
      if (*(int *)((long)puVar9 + uVar13 * 4) == 0) {
        puVar14 = (pointer)((long)puVar7 + uVar13 * 4);
      }
      else {
        puVar14 = puVar5 + *(uint *)((long)puVar8 + uVar13 * 4);
      }
      *puVar14 = startIdx;
      piVar1 = (int *)((long)puVar9 + (ulong)(uVar15 << 2));
      *piVar1 = *piVar1 + 1;
      *(uint32_t *)((long)puVar8 + (ulong)(uVar15 << 2)) = startIdx;
      startIdx = puVar5[startIdx];
      size = size - 1;
    } while (size != 0);
    bVar16 = true;
    uVar13 = 0;
    uVar12 = 0;
    do {
      size_00 = *(uint32_t *)((long)puVar9 + uVar13 * 4);
      if (size_00 != 0) {
        uVar15 = (uint)uVar13;
        pOVar10 = createOctant(this,createOctant::factor[uVar15 & 1] * extent + x,
                               *(float *)((long)createOctant::factor + (ulong)(uVar15 & 2) * 2) *
                               extent + y,createOctant::factor[3 < uVar13] * extent + z,extent * 0.5
                               ,*(uint32_t *)((long)puVar7 + uVar13 * 4),
                               *(uint32_t *)((long)puVar8 + uVar13 * 4),size_00);
        pOVar6->child[uVar13] = pOVar10;
        puVar11 = &pOVar6->start;
        if (!bVar16) {
          puVar11 = (this->successors_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start + pOVar6->child[uVar12]->end;
        }
        *puVar11 = pOVar10->start;
        pOVar6->end = pOVar10->end;
        bVar16 = false;
        uVar12 = uVar15;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 8);
    operator_delete(puVar9,0x20);
    operator_delete(puVar8,0x20);
    operator_delete(puVar7,0x20);
  }
  return pOVar6;
}

Assistant:

typename Octree<PointT, ContainerT>::Octant* Octree<PointT, ContainerT>::createOctant(float x, float y, float z,
                                                                                      float extent, uint32_t startIdx,
                                                                                      uint32_t endIdx, uint32_t size)
{
  // For a leaf we don't have to change anything; points are already correctly linked or correctly reordered.
  Octant* octant = new Octant;

  octant->isLeaf = true;

  octant->x = x;
  octant->y = y;
  octant->z = z;
  octant->extent = extent;

  octant->start = startIdx;
  octant->end = endIdx;
  octant->size = size;

  static const float factor[] = {-0.5f, 0.5f};

  // subdivide subset of points and re-link points according to Morton codes
  if (size > params_.bucketSize && extent > 2 * params_.minExtent)
  {
    octant->isLeaf = false;

    const ContainerT& points = *data_;
    std::vector<uint32_t> childStarts(8, 0);
    std::vector<uint32_t> childEnds(8, 0);
    std::vector<uint32_t> childSizes(8, 0);

    // re-link disjoint child subsets...
    uint32_t idx = startIdx;

    for (uint32_t i = 0; i < size; ++i)
    {
      const PointT& p = points[idx];

      // determine Morton code for each point...
      uint32_t mortonCode = 0;
      if (get<0>(p) > x) mortonCode |= 1;
      if (get<1>(p) > y) mortonCode |= 2;
      if (get<2>(p) > z) mortonCode |= 4;

      // set child starts and update successors...
      if (childSizes[mortonCode] == 0)
        childStarts[mortonCode] = idx;
      else
        successors_[childEnds[mortonCode]] = idx;
      childSizes[mortonCode] += 1;

      childEnds[mortonCode] = idx;
      idx = successors_[idx];
    }

    // now, we can create the child nodes...
    float childExtent = 0.5f * extent;
    bool firsttime = true;
    uint32_t lastChildIdx = 0;
    for (uint32_t i = 0; i < 8; ++i)
    {
      if (childSizes[i] == 0) continue;

      float childX = x + factor[(i & 1) > 0] * extent;
      float childY = y + factor[(i & 2) > 0] * extent;
      float childZ = z + factor[(i & 4) > 0] * extent;

      octant->child[i] = createOctant(childX, childY, childZ, childExtent, childStarts[i], childEnds[i], childSizes[i]);

      if (firsttime)
        octant->start = octant->child[i]->start;
      else
        successors_[octant->child[lastChildIdx]->end] =
            octant->child[i]->start;  // we have to ensure that also the child ends link to the next child start.

      lastChildIdx = i;
      octant->end = octant->child[i]->end;
      firsttime = false;
    }
  }

  return octant;
}